

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode wc_statemach(connectdata *conn)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  undefined8 *puVar3;
  CURLcode CVar4;
  WildcardData *pWVar5;
  char *pcVar6;
  long lVar7;
  curl_wildcard_states cVar8;
  ftp_wc *ftpwc_1;
  long userresponse;
  char *tmp_path;
  FTP *ftp;
  curl_fileinfo *finfo;
  ftp_conn *ftpc;
  ftp_wc *ftpwc;
  CURLcode result;
  WildcardData *wildcard;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  pWVar5 = &pCVar1->wildcard;
  ftpwc._4_4_ = CURLE_OK;
  switch(pWVar5->state) {
  case CURLWC_CLEAR:
  case CURLWC_ERROR:
  case CURLWC_DONE:
    if ((pCVar1->wildcard).dtor != (curl_wildcard_dtor)0x0) {
      (*(pCVar1->wildcard).dtor)((pCVar1->wildcard).protdata);
    }
    break;
  case CURLWC_INIT:
    ftpwc._4_4_ = init_wc_data(conn);
    if (pWVar5->state != CURLWC_CLEAN) {
      cVar8 = CURLWC_MATCHING;
      if (ftpwc._4_4_ != CURLE_OK) {
        cVar8 = CURLWC_ERROR;
      }
      pWVar5->state = cVar8;
    }
    break;
  case CURLWC_MATCHING:
    puVar3 = (undefined8 *)(pCVar1->wildcard).protdata;
    (conn->data->set).fwrite_func = (curl_write_callback)puVar3[1];
    (conn->data->set).out = (void *)puVar3[2];
    puVar3[1] = 0;
    puVar3[2] = 0;
    pWVar5->state = CURLWC_DOWNLOADING;
    CVar4 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
    if (CVar4 != CURLE_OK) {
      pWVar5->state = CURLWC_CLEAN;
      CVar4 = wc_statemach(conn);
      return CVar4;
    }
    if ((pCVar1->wildcard).filelist.size == 0) {
      pWVar5->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    CVar4 = wc_statemach(conn);
    return CVar4;
  case CURLWC_DOWNLOADING:
    puVar3 = (undefined8 *)((pCVar1->wildcard).filelist.head)->ptr;
    pvVar2 = (conn->data->req).protop;
    pcVar6 = curl_maprintf("%s%s",(pCVar1->wildcard).path,*puVar3);
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(*(void **)((long)pvVar2 + 0x20));
    *(char **)((long)pvVar2 + 0x18) = pcVar6;
    *(char **)((long)pvVar2 + 0x20) = pcVar6;
    Curl_infof(conn->data,"Wildcard - START of \"%s\"\n",*puVar3);
    if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
      Curl_set_in_callback(conn->data,true);
      lVar7 = (*(conn->data->set).chunk_bgn)
                        (puVar3,(pCVar1->wildcard).customptr,(int)(pCVar1->wildcard).filelist.size);
      Curl_set_in_callback(conn->data,false);
      if (lVar7 == 1) {
        return CURLE_CHUNK_FAILED;
      }
      if (lVar7 == 2) {
        Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar3);
        pWVar5->state = CURLWC_SKIP;
        CVar4 = wc_statemach(conn);
        return CVar4;
      }
    }
    if (*(int *)(puVar3 + 1) != 0) {
      pWVar5->state = CURLWC_SKIP;
      CVar4 = wc_statemach(conn);
      return CVar4;
    }
    if ((*(uint *)(puVar3 + 0xc) & 0x40) != 0) {
      (conn->proto).ftpc.known_filesize = puVar3[5];
    }
    CVar4 = ftp_parse_url_path(conn);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    Curl_llist_remove(&(pCVar1->wildcard).filelist,(pCVar1->wildcard).filelist.head,(void *)0x0);
    ftpwc._4_4_ = CURLE_OK;
    if ((pCVar1->wildcard).filelist.size == 0) {
      pWVar5->state = CURLWC_CLEAN;
      return CURLE_OK;
    }
    break;
  case CURLWC_CLEAN:
    puVar3 = (undefined8 *)(pCVar1->wildcard).protdata;
    ftpwc._4_4_ = CURLE_OK;
    if (puVar3 != (undefined8 *)0x0) {
      ftpwc._4_4_ = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
    }
    cVar8 = CURLWC_DONE;
    if (ftpwc._4_4_ != CURLE_OK) {
      cVar8 = CURLWC_ERROR;
    }
    pWVar5->state = cVar8;
    break;
  case CURLWC_SKIP:
    if ((conn->data->set).chunk_end != (curl_chunk_end_callback)0x0) {
      Curl_set_in_callback(conn->data,true);
      (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
      Curl_set_in_callback(conn->data,false);
    }
    Curl_llist_remove(&(pCVar1->wildcard).filelist,(pCVar1->wildcard).filelist.head,(void *)0x0);
    cVar8 = CURLWC_DOWNLOADING;
    if ((pCVar1->wildcard).filelist.size == 0) {
      cVar8 = CURLWC_CLEAN;
    }
    pWVar5->state = cVar8;
    CVar4 = wc_statemach(conn);
    return CVar4;
  }
  return ftpwc._4_4_;
}

Assistant:

static CURLcode wc_statemach(struct connectdata *conn)
{
  struct WildcardData * const wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;

  switch(wildcard->state) {
  case CURLWC_INIT:
    result = init_wc_data(conn);
    if(wildcard->state == CURLWC_CLEAN)
      /* only listing! */
      break;
    wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
    break;

  case CURLWC_MATCHING: {
    /* In this state is LIST response successfully parsed, so lets restore
       previous WRITEFUNCTION callback and WRITEDATA pointer */
    struct ftp_wc *ftpwc = wildcard->protdata;
    conn->data->set.fwrite_func = ftpwc->backup.write_function;
    conn->data->set.out = ftpwc->backup.file_descriptor;
    ftpwc->backup.write_function = ZERO_NULL;
    ftpwc->backup.file_descriptor = NULL;
    wildcard->state = CURLWC_DOWNLOADING;

    if(Curl_ftp_parselist_geterror(ftpwc->parser)) {
      /* error found in LIST parsing */
      wildcard->state = CURLWC_CLEAN;
      return wc_statemach(conn);
    }
    if(wildcard->filelist.size == 0) {
      /* no corresponding file */
      wildcard->state = CURLWC_CLEAN;
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    return wc_statemach(conn);
  }

  case CURLWC_DOWNLOADING: {
    /* filelist has at least one file, lets get first one */
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    struct curl_fileinfo *finfo = wildcard->filelist.head->ptr;
    struct FTP *ftp = conn->data->req.protop;

    char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
    if(!tmp_path)
      return CURLE_OUT_OF_MEMORY;

    /* switch default ftp->path and tmp_path */
    free(ftp->pathalloc);
    ftp->pathalloc = ftp->path = tmp_path;

    infof(conn->data, "Wildcard - START of \"%s\"\n", finfo->filename);
    if(conn->data->set.chunk_bgn) {
      long userresponse;
      Curl_set_in_callback(conn->data, true);
      userresponse = conn->data->set.chunk_bgn(
        finfo, wildcard->customptr, (int)wildcard->filelist.size);
      Curl_set_in_callback(conn->data, false);
      switch(userresponse) {
      case CURL_CHUNK_BGN_FUNC_SKIP:
        infof(conn->data, "Wildcard - \"%s\" skipped by user\n",
              finfo->filename);
        wildcard->state = CURLWC_SKIP;
        return wc_statemach(conn);
      case CURL_CHUNK_BGN_FUNC_FAIL:
        return CURLE_CHUNK_FAILED;
      }
    }

    if(finfo->filetype != CURLFILETYPE_FILE) {
      wildcard->state = CURLWC_SKIP;
      return wc_statemach(conn);
    }

    if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
      ftpc->known_filesize = finfo->size;

    result = ftp_parse_url_path(conn);
    if(result)
      return result;

    /* we don't need the Curl_fileinfo of first file anymore */
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);

    if(wildcard->filelist.size == 0) { /* remains only one file to down. */
      wildcard->state = CURLWC_CLEAN;
      /* after that will be ftp_do called once again and no transfer
         will be done because of CURLWC_CLEAN state */
      return CURLE_OK;
    }
  } break;

  case CURLWC_SKIP: {
    if(conn->data->set.chunk_end) {
      Curl_set_in_callback(conn->data, true);
      conn->data->set.chunk_end(conn->data->wildcard.customptr);
      Curl_set_in_callback(conn->data, false);
    }
    Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);
    wildcard->state = (wildcard->filelist.size == 0) ?
                      CURLWC_CLEAN : CURLWC_DOWNLOADING;
    return wc_statemach(conn);
  }

  case CURLWC_CLEAN: {
    struct ftp_wc *ftpwc = wildcard->protdata;
    result = CURLE_OK;
    if(ftpwc)
      result = Curl_ftp_parselist_geterror(ftpwc->parser);

    wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
  } break;

  case CURLWC_DONE:
  case CURLWC_ERROR:
  case CURLWC_CLEAR:
    if(wildcard->dtor)
      wildcard->dtor(wildcard->protdata);
    break;
  }

  return result;
}